

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  bool bVar1;
  ImGuiWindow *window;
  uint in_EDI;
  undefined1 popup_hierarchy_00;
  bool result;
  bool popup_hierarchy;
  ImGuiWindow *cur_window;
  ImGuiWindow *ref_window;
  ImGuiContext *g;
  bool local_22;
  ImGuiWindow *window_00;
  ImGuiContext *pIVar2;
  undefined4 in_stack_fffffffffffffffc;
  
  window_00 = GImGui->HoveredWindow;
  window = GImGui->CurrentWindow;
  if (window_00 == (ImGuiWindow *)0x0) {
    bVar1 = false;
  }
  else {
    pIVar2 = GImGui;
    if ((in_EDI & 4) == 0) {
      popup_hierarchy_00 = (in_EDI & 8) == 0;
      if ((in_EDI & 2) != 0) {
        window = GetCombinedRootWindow(window,(bool)popup_hierarchy_00);
      }
      if ((in_EDI & 1) == 0) {
        local_22 = window_00 == window;
      }
      else {
        local_22 = IsWindowChildOf(window_00,window,(bool)popup_hierarchy_00);
      }
      if (local_22 == false) {
        return false;
      }
    }
    bVar1 = IsWindowContentHoverable
                      ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                       (ImGuiHoveredFlags)((ulong)pIVar2 >> 0x20));
    if (bVar1) {
      if (((((in_EDI & 0x80) == 0) && (pIVar2->ActiveId != 0)) &&
          ((pIVar2->ActiveIdAllowOverlap & 1U) == 0)) && (pIVar2->ActiveId != window_00->MoveId)) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.HoveredWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;
    if (ref_window == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        IM_ASSERT(cur_window); // Not inside a Begin()/End()
        const bool popup_hierarchy = (flags & ImGuiHoveredFlags_NoPopupHierarchy) == 0;
        if (flags & ImGuiHoveredFlags_RootWindow)
            cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy);

        bool result;
        if (flags & ImGuiHoveredFlags_ChildWindows)
            result = IsWindowChildOf(ref_window, cur_window, popup_hierarchy);
        else
            result = (ref_window == cur_window);
        if (!result)
            return false;
    }

    if (!IsWindowContentHoverable(ref_window, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != ref_window->MoveId)
            return false;
    return true;
}